

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_serverwindow.h
# Opt level: O2

void __thiscall Ui_ServerWindow::setupUi(Ui_ServerWindow *this,QWidget *ServerWindow)

{
  storage_type *psVar1;
  QGridLayout *this_00;
  QLabel *pQVar2;
  QPlainTextEdit *this_01;
  QSpacerItem *pQVar3;
  QPushButton *this_02;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QArrayDataPointer<char16_t> local_48;
  
  QObject::objectName();
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (local_48.size == 0) {
    psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("ServerWindow",0xd);
    QVar4.m_data = psVar1;
    QVar4.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar4);
    QObject::setObjectName((QString *)ServerWindow);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  QWidget::resize(ServerWindow,400,300);
  this_00 = (QGridLayout *)operator_new(0x20);
  QGridLayout::QGridLayout(this_00,ServerWindow);
  this->gridLayout = this_00;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("gridLayout",0xb);
  QVar5.m_data = psVar1;
  QVar5.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar5);
  QObject::setObjectName((QString *)this_00);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  pQVar2 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar2,ServerWindow,0);
  this->label = pQVar2;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("label",6);
  QVar6.m_data = psVar1;
  QVar6.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar6);
  QObject::setObjectName((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QGridLayout::addWidget(this->gridLayout,this->label,0,0,1,2,0);
  this_01 = (QPlainTextEdit *)operator_new(0x28);
  QPlainTextEdit::QPlainTextEdit(this_01,ServerWindow);
  this->logEditor = this_01;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("logEditor",10);
  QVar7.m_data = psVar1;
  QVar7.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar7);
  QObject::setObjectName((QString *)this_01);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QPlainTextEdit::setReadOnly(SUB81(this->logEditor,0));
  QGridLayout::addWidget(this->gridLayout,this->logEditor,1,0,1,2,0);
  pQVar3 = (QSpacerItem *)operator_new(0x28);
  *(code **)pQVar3 = QObject::objectName;
  *(undefined8 *)(pQVar3 + 8) = 0x12a00000000;
  *(undefined8 *)(pQVar3 + 0x10) = 0x17000000000014;
  *(undefined4 *)(pQVar3 + 0x18) = 0;
  *(undefined4 *)(pQVar3 + 0x1c) = 0;
  *(undefined4 *)(pQVar3 + 0x20) = 0xffffffff;
  *(undefined4 *)(pQVar3 + 0x24) = 0xffffffff;
  this->horizontalSpacer = pQVar3;
  QGridLayout::addItem(this->gridLayout,pQVar3,2,0,1,1,0);
  this_02 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(this_02,ServerWindow);
  this->startStopButton = this_02;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("startStopButton",0x10);
  QVar8.m_data = psVar1;
  QVar8.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar8);
  QObject::setObjectName((QString *)this_02);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QGridLayout::addWidget(this->gridLayout,this->startStopButton,2,1,1,1,0);
  retranslateUi(this,ServerWindow);
  QMetaObject::connectSlotsByName((QObject *)ServerWindow);
  return;
}

Assistant:

void setupUi(QWidget *ServerWindow)
    {
        if (ServerWindow->objectName().isEmpty())
            ServerWindow->setObjectName(QString::fromUtf8("ServerWindow"));
        ServerWindow->resize(400, 300);
        gridLayout = new QGridLayout(ServerWindow);
        gridLayout->setObjectName(QString::fromUtf8("gridLayout"));
        label = new QLabel(ServerWindow);
        label->setObjectName(QString::fromUtf8("label"));

        gridLayout->addWidget(label, 0, 0, 1, 2);

        logEditor = new QPlainTextEdit(ServerWindow);
        logEditor->setObjectName(QString::fromUtf8("logEditor"));
        logEditor->setReadOnly(true);

        gridLayout->addWidget(logEditor, 1, 0, 1, 2);

        horizontalSpacer = new QSpacerItem(298, 20, QSizePolicy::Expanding, QSizePolicy::Minimum);

        gridLayout->addItem(horizontalSpacer, 2, 0, 1, 1);

        startStopButton = new QPushButton(ServerWindow);
        startStopButton->setObjectName(QString::fromUtf8("startStopButton"));

        gridLayout->addWidget(startStopButton, 2, 1, 1, 1);


        retranslateUi(ServerWindow);

        QMetaObject::connectSlotsByName(ServerWindow);
    }